

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O0

bool google::protobuf::compiler::annotation_test_util::AnnotationMatchesSubstring
               (string *file_content,Annotation *annotation,string *expected_text)

{
  pointer expected_text_00;
  Annotation *file_content_00;
  bool bVar1;
  optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic> local_4c [2];
  undefined1 local_38 [8];
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  string *expected_text_local;
  Annotation *annotation_local;
  string *file_content_local;
  
  annotations.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)expected_text;
  expected_text_local = (string *)annotation;
  annotation_local = (Annotation *)file_content;
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::vector((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            *)local_38);
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::push_back((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *)local_38,(value_type *)&expected_text_local);
  file_content_00 = annotation_local;
  expected_text_00 =
       annotations.
       super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>::optional(local_4c);
  bVar1 = AtLeastOneAnnotationMatchesSubstring
                    ((string *)file_content_00,
                     (vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                      *)local_38,(string *)expected_text_00,local_4c[0]);
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::~vector((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
             *)local_38);
  return bVar1;
}

Assistant:

bool AnnotationMatchesSubstring(const std::string& file_content,
                                const GeneratedCodeInfo::Annotation* annotation,
                                const std::string& expected_text) {
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  annotations.push_back(annotation);
  return AtLeastOneAnnotationMatchesSubstring(file_content, annotations,
                                              expected_text);
}